

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_Dialog.cxx
# Opt level: O1

void __thiscall Fl_Help_Dialog::Fl_Help_Dialog(Fl_Help_Dialog *this)

{
  Fl_Input *pFVar1;
  Fl_Window *this_00;
  Fl_Double_Window *this_01;
  Fl_Group *pFVar2;
  Fl_Button *pFVar3;
  Fl_Group *pFVar4;
  Fl_Widget *pFVar5;
  Fl_Help_View *this_02;
  
  this_01 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(this_01,0x212,0x181,"Help Dialog");
  this->window_ = this_01;
  (this_01->super_Fl_Window).super_Fl_Group.super_Fl_Widget.user_data_ = this;
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,10,0x1ff,0x19,(char *)0x0);
  pFVar3 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar3,10,10,0x19,0x19,"@<-");
  this->back_ = pFVar3;
  Fl_Widget::tooltip((Fl_Widget *)pFVar3,"Show the previous help page.");
  pFVar3 = this->back_;
  pFVar3->shortcut_ = 0xff51;
  (pFVar3->super_Fl_Widget).label_.color = 2;
  (pFVar3->super_Fl_Widget).callback_ = cb_back_;
  pFVar3 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar3,0x2d,10,0x19,0x19,"@->");
  this->forward_ = pFVar3;
  Fl_Widget::tooltip((Fl_Widget *)pFVar3,"Show the next help page.");
  pFVar3 = this->forward_;
  pFVar3->shortcut_ = 0xff53;
  (pFVar3->super_Fl_Widget).label_.color = 2;
  (pFVar3->super_Fl_Widget).callback_ = cb_forward_;
  pFVar3 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar3,0x50,10,0x19,0x19,"F");
  this->smaller_ = pFVar3;
  Fl_Widget::tooltip((Fl_Widget *)pFVar3,"Make the help text smaller.");
  pFVar3 = this->smaller_;
  (pFVar3->super_Fl_Widget).label_.font = 1;
  (pFVar3->super_Fl_Widget).label_.size = 10;
  (pFVar3->super_Fl_Widget).callback_ = cb_smaller_;
  pFVar3 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar3,0x73,10,0x19,0x19,"F");
  this->larger_ = pFVar3;
  Fl_Widget::tooltip((Fl_Widget *)pFVar3,"Make the help text larger.");
  pFVar3 = this->larger_;
  (pFVar3->super_Fl_Widget).label_.font = 1;
  (pFVar3->super_Fl_Widget).label_.size = 0x10;
  (pFVar3->super_Fl_Widget).callback_ = cb_larger_;
  pFVar4 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar4,0x15e,10,0xab,0x19,(char *)0x0);
  (pFVar4->super_Fl_Widget).box_ = '\x03';
  (pFVar4->super_Fl_Widget).color_ = 7;
  pFVar5 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar5,0x177,0xc,0x8f,0x15,"@search");
  this->find_ = (Fl_Input *)pFVar5;
  Fl_Widget::tooltip(pFVar5,"find text in document");
  pFVar1 = this->find_;
  (pFVar1->super_Fl_Input_).super_Fl_Widget.box_ = '\x01';
  (pFVar1->super_Fl_Input_).super_Fl_Widget.when_ = '\n';
  (pFVar1->super_Fl_Input_).super_Fl_Widget.label_.size = 0xd;
  (pFVar1->super_Fl_Input_).textfont_ = 4;
  (pFVar1->super_Fl_Input_).super_Fl_Widget.callback_ = cb_find_;
  Fl_Group::end(pFVar4);
  pFVar5 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar5,0x96,10,0xbe,0x19,(char *)0x0);
  pFVar4 = Fl_Group::current();
  pFVar4->resizable_ = pFVar5;
  Fl_Group::end(pFVar2);
  this_02 = (Fl_Help_View *)operator_new(0x1b38);
  Fl_Help_View::Fl_Help_View(this_02,10,0x2d,0x1fe,0x14a,(char *)0x0);
  this->view_ = this_02;
  (this_02->super_Fl_Group).super_Fl_Widget.box_ = '\x03';
  (this_02->super_Fl_Group).super_Fl_Widget.callback_ = cb_view_;
  pFVar2 = Fl_Group::current();
  pFVar2->resizable_ = (Fl_Widget *)this->view_;
  this_00 = &this->window_->super_Fl_Window;
  this_00->minw = 0x104;
  this_00->minh = 0x96;
  this_00->aspect = 0;
  this_00->maxw = 0;
  this_00->maxh = 0;
  this_00->dw = 0;
  this_00->dh = 0;
  Fl_Window::size_range_(this_00);
  Fl_Group::end((Fl_Group *)this->window_);
  Fl_Widget::deactivate(&this->back_->super_Fl_Widget);
  Fl_Widget::deactivate(&this->forward_->super_Fl_Widget);
  this->index_ = -1;
  this->max_ = 0;
  this->find_pos_ = 0;
  fl_register_images();
  return;
}

Assistant:

Fl_Help_Dialog::Fl_Help_Dialog() {
  { window_ = new Fl_Double_Window(530, 385, "Help Dialog");
    window_->user_data((void*)(this));
    { Fl_Group* o = new Fl_Group(10, 10, 511, 25);
      { back_ = new Fl_Button(10, 10, 25, 25, "@<-");
        back_->tooltip("Show the previous help page.");
        back_->shortcut(0xff51);
        back_->labelcolor((Fl_Color)2);
        back_->callback((Fl_Callback*)cb_back_);
      } // Fl_Button* back_
      { forward_ = new Fl_Button(45, 10, 25, 25, "@->");
        forward_->tooltip("Show the next help page.");
        forward_->shortcut(0xff53);
        forward_->labelcolor((Fl_Color)2);
        forward_->callback((Fl_Callback*)cb_forward_);
      } // Fl_Button* forward_
      { smaller_ = new Fl_Button(80, 10, 25, 25, "F");
        smaller_->tooltip("Make the help text smaller.");
        smaller_->labelfont(1);
        smaller_->labelsize(10);
        smaller_->callback((Fl_Callback*)cb_smaller_);
      } // Fl_Button* smaller_
      { larger_ = new Fl_Button(115, 10, 25, 25, "F");
        larger_->tooltip("Make the help text larger.");
        larger_->labelfont(1);
        larger_->labelsize(16);
        larger_->callback((Fl_Callback*)cb_larger_);
      } // Fl_Button* larger_
      { Fl_Group* o = new Fl_Group(350, 10, 171, 25);
        o->box(FL_DOWN_BOX);
        o->color(FL_BACKGROUND2_COLOR);
        { find_ = new Fl_Input(375, 12, 143, 21, "@search");
          find_->tooltip("find text in document");
          find_->box(FL_FLAT_BOX);
          find_->labelsize(13);
          find_->textfont(4);
          find_->callback((Fl_Callback*)cb_find_);
          find_->when(FL_WHEN_ENTER_KEY_ALWAYS);
        } // Fl_Input* find_
        o->end();
      } // Fl_Group* o
      { Fl_Box* o = new Fl_Box(150, 10, 190, 25);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    { view_ = new Fl_Help_View(10, 45, 510, 330);
      view_->box(FL_DOWN_BOX);
      view_->callback((Fl_Callback*)cb_view_);
      Fl_Group::current()->resizable(view_);
    } // Fl_Help_View* view_
    window_->size_range(260, 150);
    window_->end();
  } // Fl_Double_Window* window_
  back_->deactivate();
  forward_->deactivate();
  
  index_    = -1;
  max_      = 0;
  find_pos_ = 0;
  
  fl_register_images();
}